

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__limit
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  StackMemoryManager *this_00;
  char **ppcVar2;
  long *in_RSI;
  bool *in_RDI;
  bool failed_2;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  limit__AttributeData *attributeData;
  URI *in_stack_fffffffffffffbb8;
  URI *other;
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  *in_stack_fffffffffffffbc0;
  void **in_stack_fffffffffffffbc8;
  ParserTemplateBase *in_stack_fffffffffffffbd0;
  ErrorType in_stack_fffffffffffffbe8;
  Severity in_stack_fffffffffffffbec;
  ParserTemplateBase *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  char *in_stack_fffffffffffffc08;
  URI *in_stack_fffffffffffffc10;
  XSList<GeneratedSaxParser::ParserString> local_330;
  undefined1 local_320 [719];
  byte local_51;
  char *local_50;
  StackMemoryManager *local_48;
  ParserChar *local_40;
  undefined8 *local_38;
  limit__AttributeData *local_30;
  long *local_18;
  
  local_18 = in_RSI;
  local_30 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::limit__AttributeData>
                       (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  local_38 = (undefined8 *)*local_18;
  if (local_38 != (undefined8 *)0x0) {
    while (local_40 = (ParserChar *)*local_38, local_40 != (ParserChar *)0x0) {
      this_00 = (StackMemoryManager *)GeneratedSaxParser::Utils::calculateStringHash(local_40);
      if (local_38 + 1 == (undefined8 *)0x0) {
        return false;
      }
      local_50 = (char *)local_38[1];
      local_38 = local_38 + 2;
      local_48 = this_00;
      if (this_00 == (StackMemoryManager *)0x6f4) {
        local_30->id = local_50;
      }
      else if (this_00 == (StackMemoryManager *)0x6f8b6) {
        GeneratedSaxParser::Utils::toURI
                  ((ParserChar **)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   in_RDI);
        COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbc0);
        if (((local_320[0x1d2] & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                               in_stack_fffffffffffffbe8,(StringHash)in_RDI,(StringHash)this_00,
                               (ParserChar *)in_stack_fffffffffffffbd0), bVar1)) {
          return false;
        }
        if ((local_320[0x1d2] & 1) == 0) {
          local_30->present_attributes = local_30->present_attributes | 4;
        }
      }
      else if (this_00 == (StackMemoryManager *)0x7f8b6) {
        local_30->xref = local_50;
      }
      else if (this_00 == (StackMemoryManager *)((long)&__DT_RELA[0x73e2].r_info + 4)) {
        in_stack_fffffffffffffbd0 = (ParserTemplateBase *)(local_320 + 0x1e0);
        GeneratedSaxParser::Utils::toURI
                  ((ParserChar **)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   in_RDI);
        COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbc0);
        if (((local_51 & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                               in_stack_fffffffffffffbe8,(StringHash)in_RDI,(StringHash)this_00,
                               (ParserChar *)in_stack_fffffffffffffbd0), bVar1)) {
          return false;
        }
        if ((local_51 & 1) == 0) {
          local_30->present_attributes = local_30->present_attributes | 1;
        }
      }
      else if (this_00 == (StackMemoryManager *)((long)&__DT_RELA[0x12848].r_addend + 3)) {
        bVar1 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::characterData2StringList
                          (in_stack_fffffffffffffbc0,(ParserChar *)in_stack_fffffffffffffbb8,
                           (XSList<GeneratedSaxParser::ParserString> *)0xa3d147);
        local_320[0x1d3] = (bVar1 ^ 0xffU) & 1;
        if ((local_320[0x1d3] != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                               in_stack_fffffffffffffbe8,(StringHash)in_RDI,(StringHash)this_00,
                               (ParserChar *)in_stack_fffffffffffffbd0), bVar1)) {
          return false;
        }
        if ((local_320[0x1d3] & 1) == 0) {
          local_30->present_attributes = local_30->present_attributes | 2;
        }
      }
      else if (this_00 == (StackMemoryManager *)0x7ac025) {
        local_30->style = local_50;
      }
      else if (this_00 == (StackMemoryManager *)0x4a5aa87) {
        local_30->encoding = local_50;
      }
      else {
        if ((local_30->unknownAttributes).data == (char **)0x0) {
          ppcVar2 = (char **)GeneratedSaxParser::StackMemoryManager::newObject
                                       (this_00,(size_t)in_stack_fffffffffffffbd0);
          (local_30->unknownAttributes).data = ppcVar2;
        }
        else {
          ppcVar2 = (char **)GeneratedSaxParser::StackMemoryManager::growObject
                                       ((StackMemoryManager *)in_stack_fffffffffffffbf8,
                                        (size_t)in_stack_fffffffffffffbf0);
          (local_30->unknownAttributes).data = ppcVar2;
        }
        (local_30->unknownAttributes).data[(local_30->unknownAttributes).size] = local_40;
        (local_30->unknownAttributes).data[(local_30->unknownAttributes).size + 1] = local_50;
        (local_30->unknownAttributes).size = (local_30->unknownAttributes).size + 2;
      }
    }
    local_40 = (ParserChar *)0x0;
  }
  if ((local_30->present_attributes & 1) == 0) {
    in_stack_fffffffffffffbc0 =
         (ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
          *)local_320;
    COLLADABU::URI::URI(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbc0);
  }
  if ((local_30->present_attributes & 2) == 0) {
    GeneratedSaxParser::XSList<GeneratedSaxParser::ParserString>::XSList(&local_330);
    (local_30->_class).data = local_330.data;
    (local_30->_class).size = local_330.size;
  }
  if ((local_30->present_attributes & 4) == 0) {
    other = (URI *)&stack0xfffffffffffffbe8;
    COLLADABU::URI::URI(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    COLLADABU::URI::operator=((URI *)in_stack_fffffffffffffbc0,other);
    COLLADABU::URI::~URI((URI *)in_stack_fffffffffffffbc0);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__limit( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__limit( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

limit__AttributeData* attributeData = newData<limit__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIMIT,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= limit__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_LIMIT, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIMIT,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIMIT,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= limit__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIMIT,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= limit__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & limit__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}
if ((attributeData->present_attributes & limit__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & limit__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}